

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vector3.cpp
# Opt level: O3

ostream * operator<<(ostream *out,Vector3 *v)

{
  ostream *poVar1;
  char local_14;
  char local_13;
  char local_12;
  char local_11;
  
  std::__ostream_insert<char,std::char_traits<char>>(out,&local_14,1);
  poVar1 = std::ostream::_M_insert<double>(v->x);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_13,1);
  poVar1 = std::ostream::_M_insert<double>(v->y);
  std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_12,1);
  poVar1 = std::ostream::_M_insert<double>(v->z);
  poVar1 = std::__ostream_insert<char,std::char_traits<char>>(poVar1,&local_11,1);
  return poVar1;
}

Assistant:

std::ostream& operator<<(std::ostream& out, const Vector3& v)
{
    return out << '(' << v.x << ' ' << v.y << ' ' << v.z << ')';
}